

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDyndepCollation.cxx
# Opt level: O2

unique_ptr<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter> __thiscall
cmDyndepCollation::ParseExportInfo(cmDyndepCollation *this,Value *tdi)

{
  string *a;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
  *this_00;
  size_type sVar1;
  bool bVar2;
  cmFileSetVisibility cVar3;
  cmCxxModuleExportInfo *this_01;
  Value *pVVar4;
  Value *pVVar5;
  mapped_type *this_02;
  Value *pVVar6;
  const_iterator cVar7;
  string_view name;
  CxxModuleExport exp;
  String local_118;
  ValueHolder local_f8;
  size_t local_f0;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  undefined8 local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined8 local_b8;
  undefined1 *local_b0;
  ulong local_a8;
  undefined1 local_a0 [8];
  ulong *local_98;
  undefined1 *local_90;
  ulong local_88;
  undefined1 local_80 [8];
  ulong *local_78;
  undefined1 *local_70;
  ulong local_68;
  undefined1 local_60 [8];
  undefined1 local_58;
  ValueIteratorBase local_50;
  SelfType local_40;
  
  this_01 = (cmCxxModuleExportInfo *)operator_new(0x118);
  cmCxxModuleExportInfo::cmCxxModuleExportInfo(this_01);
  *(cmCxxModuleExportInfo **)this = this_01;
  pVVar4 = Json::Value::operator[](tdi,"config");
  Json::Value::asString_abi_cxx11_((String *)&local_f8,pVVar4);
  std::__cxx11::string::operator=((string *)&this_01->Config,(string *)&local_f8.bool_);
  std::__cxx11::string::~string((string *)&local_f8.bool_);
  if ((this_01->Config)._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&this_01->Config);
  }
  pVVar4 = Json::Value::operator[](tdi,"exports");
  bVar2 = Json::Value::isArray(pVVar4);
  if (bVar2) {
    cVar7 = Json::Value::begin(pVVar4);
    local_50.current_ = cVar7.super_ValueIteratorBase.current_._M_node;
    local_50.isNull_ = cVar7.super_ValueIteratorBase.isNull_;
    cVar7 = Json::Value::end(pVVar4);
    local_40.current_ = cVar7.super_ValueIteratorBase.current_._M_node;
    local_40.isNull_ = cVar7.super_ValueIteratorBase.isNull_;
    while( true ) {
      bVar2 = Json::ValueIteratorBase::operator!=(&local_50,&local_40);
      if (!bVar2) break;
      pVVar4 = Json::ValueIteratorBase::deref(&local_50);
      local_f8.string_ = local_e8;
      local_f0 = 0;
      local_e8[0] = 0;
      local_d8 = &local_c8;
      local_d0 = 0;
      local_c8._M_local_buf[0] = '\0';
      local_b8 = &local_a8;
      local_b0 = (undefined1 *)0x0;
      local_a8 = local_a8 & 0xffffffffffffff00;
      local_98 = &local_88;
      local_90 = (undefined1 *)0x0;
      local_88 = local_88 & 0xffffffffffffff00;
      local_78 = &local_68;
      local_70 = (undefined1 *)0x0;
      local_68 = local_68 & 0xffffffffffffff00;
      pVVar5 = Json::Value::operator[](pVVar4,"install");
      local_58 = Json::Value::asBool(pVVar5);
      pVVar5 = Json::Value::operator[](pVVar4,"export-name");
      Json::Value::asString_abi_cxx11_(&local_118,pVVar5);
      std::__cxx11::string::operator=((string *)&local_f8.bool_,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      pVVar5 = Json::Value::operator[](pVVar4,"destination");
      Json::Value::asString_abi_cxx11_(&local_118,pVVar5);
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      pVVar5 = Json::Value::operator[](pVVar4,"export-prefix");
      Json::Value::asString_abi_cxx11_(&local_118,pVVar5);
      std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      pVVar5 = Json::Value::operator[](pVVar4,"cxx-module-info-dir");
      Json::Value::asString_abi_cxx11_(&local_118,pVVar5);
      std::__cxx11::string::operator=((string *)&local_98,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      pVVar4 = Json::Value::operator[](pVVar4,"namespace");
      Json::Value::asString_abi_cxx11_(&local_118,pVVar4);
      std::__cxx11::string::operator=((string *)&local_78,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::vector<CxxModuleExport,_std::allocator<CxxModuleExport>_>::push_back
                (&this_01->Exports,(value_type *)&local_f8);
      CxxModuleExport::~CxxModuleExport((CxxModuleExport *)&local_f8);
      Json::ValueIteratorBase::increment(&local_50);
    }
  }
  pVVar4 = Json::Value::operator[](tdi,"bmi-installation");
  bVar2 = Json::Value::isObject(pVVar4);
  if (bVar2) {
    local_f8.string_ = local_e8;
    local_f0 = 0;
    local_e8[0] = 0;
    local_d8 = &local_c8;
    local_d0 = 0;
    local_c8._M_local_buf[0] = '\0';
    local_b0 = local_a0;
    local_a8 = 0;
    local_a0[0] = 0;
    local_90 = local_80;
    local_88 = 0;
    local_80[0] = 0;
    local_70 = local_60;
    local_68 = 0;
    local_60[0] = 0;
    pVVar5 = Json::Value::operator[](pVVar4,"component");
    Json::Value::asString_abi_cxx11_(&local_118,pVVar5);
    std::__cxx11::string::operator=((string *)&local_f8.bool_,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    pVVar5 = Json::Value::operator[](pVVar4,"destination");
    Json::Value::asString_abi_cxx11_(&local_118,pVVar5);
    std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    pVVar5 = Json::Value::operator[](pVVar4,"exclude-from-all");
    bVar2 = Json::Value::asBool(pVVar5);
    local_b8 = (ulong *)CONCAT71(local_b8._1_7_,bVar2);
    pVVar5 = Json::Value::operator[](pVVar4,"optional");
    bVar2 = Json::Value::asBool(pVVar5);
    local_b8._0_2_ = CONCAT11(bVar2,local_b8._0_1_);
    pVVar5 = Json::Value::operator[](pVVar4,"permissions");
    Json::Value::asString_abi_cxx11_(&local_118,pVVar5);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    pVVar5 = Json::Value::operator[](pVVar4,"message-level");
    Json::Value::asString_abi_cxx11_(&local_118,pVVar5);
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    pVVar4 = Json::Value::operator[](pVVar4,"script-location");
    Json::Value::asString_abi_cxx11_(&local_118,pVVar4);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::optional<CxxModuleBmiInstall>::operator=
              (&this_01->BmiInstallation,(CxxModuleBmiInstall *)&local_f8);
    CxxModuleBmiInstall::~CxxModuleBmiInstall((CxxModuleBmiInstall *)&local_f8);
  }
  pVVar4 = Json::Value::operator[](tdi,"cxx-modules");
  bVar2 = Json::Value::isObject(pVVar4);
  if (bVar2) {
    cVar7 = Json::Value::begin(pVVar4);
    local_50.current_ = cVar7.super_ValueIteratorBase.current_._M_node;
    local_50.isNull_ = cVar7.super_ValueIteratorBase.isNull_;
    while( true ) {
      cVar7 = Json::Value::end(pVVar4);
      local_f8.int_ = (LargestInt)cVar7.super_ValueIteratorBase.current_._M_node;
      local_f0 = CONCAT71(local_f0._1_7_,cVar7.super_ValueIteratorBase.isNull_);
      bVar2 = Json::ValueIteratorBase::operator!=(&local_50,(SelfType *)&local_f8);
      if (!bVar2) break;
      this_00 = *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
                  **)this;
      Json::ValueIteratorBase::key((Value *)&local_f8,&local_50);
      Json::Value::asString_abi_cxx11_(&local_118,(Value *)&local_f8);
      this_02 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
                ::operator[](this_00,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      Json::Value::~Value((Value *)&local_f8);
      pVVar5 = Json::ValueIteratorBase::deref(&local_50);
      pVVar6 = Json::Value::operator[](pVVar5,"name");
      Json::Value::asString_abi_cxx11_((String *)&local_f8,pVVar6);
      std::__cxx11::string::operator=((string *)this_02,(string *)&local_f8.bool_);
      std::__cxx11::string::~string((string *)&local_f8.bool_);
      pVVar6 = Json::Value::operator[](pVVar5,"bmi-only");
      bVar2 = Json::Value::asBool(pVVar6);
      this_02->BmiOnly = bVar2;
      pVVar6 = Json::Value::operator[](pVVar5,"relative-directory");
      Json::Value::asString_abi_cxx11_((String *)&local_f8,pVVar6);
      a = &this_02->RelativeDirectory;
      std::__cxx11::string::operator=((string *)a,(string *)&local_f8.bool_);
      std::__cxx11::string::~string((string *)&local_f8.bool_);
      sVar1 = (this_02->RelativeDirectory)._M_string_length;
      if ((sVar1 != 0) && ((a->_M_dataplus)._M_p[sVar1 - 1] != '/')) {
        local_118._M_dataplus._M_p._0_1_ = 0x2f;
        cmStrCat<std::__cxx11::string&,char>((string *)&local_f8,a,(char *)&local_118);
        std::__cxx11::string::operator=((string *)a,(string *)&local_f8.bool_);
        std::__cxx11::string::~string((string *)&local_f8.bool_);
      }
      pVVar6 = Json::Value::operator[](pVVar5,"source");
      Json::Value::asString_abi_cxx11_((String *)&local_f8,pVVar6);
      std::__cxx11::string::operator=((string *)&this_02->SourcePath,(string *)&local_f8.bool_);
      std::__cxx11::string::~string((string *)&local_f8.bool_);
      pVVar6 = Json::Value::operator[](pVVar5,"type");
      Json::Value::asString_abi_cxx11_((String *)&local_f8,pVVar6);
      std::__cxx11::string::operator=((string *)&this_02->Type,(string *)&local_f8.bool_);
      std::__cxx11::string::~string((string *)&local_f8.bool_);
      pVVar6 = Json::Value::operator[](pVVar5,"visibility");
      Json::Value::asString_abi_cxx11_((String *)&local_f8,pVVar6);
      name._M_str = local_f8.string_;
      name._M_len = local_f0;
      cVar3 = cmFileSetVisibilityFromName(name,(cmMakefile *)0x0);
      this_02->Visibility = cVar3;
      std::__cxx11::string::~string((string *)&local_f8.bool_);
      pVVar5 = Json::Value::operator[](pVVar5,"destination");
      bVar2 = Json::Value::isString(pVVar5);
      if (bVar2) {
        Json::Value::asString_abi_cxx11_((String *)&local_f8,pVVar5);
        std::optional<std::__cxx11::string>::operator=
                  ((optional<std::__cxx11::string> *)&this_02->Destination,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
        std::__cxx11::string::~string((string *)&local_f8.bool_);
      }
      Json::ValueIteratorBase::increment(&local_50);
    }
  }
  return (__uniq_ptr_data<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter,_true,_true>)
         (__uniq_ptr_data<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter,_true,_true>)this;
}

Assistant:

std::unique_ptr<cmCxxModuleExportInfo, cmCxxModuleExportInfoDeleter>
cmDyndepCollation::ParseExportInfo(Json::Value const& tdi)
{
  auto export_info =
    std::unique_ptr<cmCxxModuleExportInfo, cmCxxModuleExportInfoDeleter>(
      new cmCxxModuleExportInfo);

  export_info->Config = tdi["config"].asString();
  if (export_info->Config.empty()) {
    export_info->Config = "noconfig";
  }
  Json::Value const& tdi_exports = tdi["exports"];
  if (tdi_exports.isArray()) {
    for (auto const& tdi_export : tdi_exports) {
      CxxModuleExport exp;
      exp.Install = tdi_export["install"].asBool();
      exp.Name = tdi_export["export-name"].asString();
      exp.Destination = tdi_export["destination"].asString();
      exp.Prefix = tdi_export["export-prefix"].asString();
      exp.CxxModuleInfoDir = tdi_export["cxx-module-info-dir"].asString();
      exp.Namespace = tdi_export["namespace"].asString();

      export_info->Exports.push_back(exp);
    }
  }
  auto const& bmi_installation = tdi["bmi-installation"];
  if (bmi_installation.isObject()) {
    CxxModuleBmiInstall bmi_install;

    bmi_install.Component = bmi_installation["component"].asString();
    bmi_install.Destination = bmi_installation["destination"].asString();
    bmi_install.ExcludeFromAll = bmi_installation["exclude-from-all"].asBool();
    bmi_install.Optional = bmi_installation["optional"].asBool();
    bmi_install.Permissions = bmi_installation["permissions"].asString();
    bmi_install.MessageLevel = bmi_installation["message-level"].asString();
    bmi_install.ScriptLocation =
      bmi_installation["script-location"].asString();

    export_info->BmiInstallation = bmi_install;
  }
  Json::Value const& tdi_cxx_modules = tdi["cxx-modules"];
  if (tdi_cxx_modules.isObject()) {
    for (auto i = tdi_cxx_modules.begin(); i != tdi_cxx_modules.end(); ++i) {
      CxxModuleFileSet& fsi = export_info->ObjectToFileSet[i.key().asString()];
      auto const& tdi_cxx_module_info = *i;
      fsi.Name = tdi_cxx_module_info["name"].asString();
      fsi.BmiOnly = tdi_cxx_module_info["bmi-only"].asBool();
      fsi.RelativeDirectory =
        tdi_cxx_module_info["relative-directory"].asString();
      if (!fsi.RelativeDirectory.empty() &&
          fsi.RelativeDirectory.back() != '/') {
        fsi.RelativeDirectory = cmStrCat(fsi.RelativeDirectory, '/');
      }
      fsi.SourcePath = tdi_cxx_module_info["source"].asString();
      fsi.Type = tdi_cxx_module_info["type"].asString();
      fsi.Visibility = cmFileSetVisibilityFromName(
        tdi_cxx_module_info["visibility"].asString(), nullptr);
      auto const& tdi_fs_dest = tdi_cxx_module_info["destination"];
      if (tdi_fs_dest.isString()) {
        fsi.Destination = tdi_fs_dest.asString();
      }
    }
  }

  return export_info;
}